

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::LogParameter::ByteSizeLong(LogParameter *this)

{
  bool bVar1;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  LogParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = LogParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_shift(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
    bVar1 = has_base(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
    bVar1 = has_scale(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t LogParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.LogParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional float shift = 3 [default = 0];
    if (has_shift()) {
      total_size += 1 + 4;
    }

    // optional float base = 1 [default = -1];
    if (has_base()) {
      total_size += 1 + 4;
    }

    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}